

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgemm.hpp
# Opt level: O0

void remora::bindings::mgemm<float,float,remora::bindings::gemm_block_size<float>>
               (undefined4 param_1,long param_2,long param_3,undefined8 param_4,undefined8 param_5,
               undefined8 param_6,long param_7,size_t param_8,size_t param_9,float *param_10,
               undefined8 param_11,undefined8 param_12,undefined8 param_13,undefined8 param_14)

{
  unsigned_long *puVar1;
  long lVar2;
  long lVar3;
  size_t j0;
  size_t i0;
  float CTempBlock [64];
  float *CBlockStart;
  size_t mr;
  size_t i;
  size_t nr;
  size_t j;
  size_t np;
  size_t mp;
  ulong local_1a0;
  ulong local_198;
  uint in_stack_fffffffffffffe70;
  unsigned_long in_stack_fffffffffffffe78;
  float *in_stack_fffffffffffffe80;
  unsigned_long local_80;
  unsigned_long local_78;
  ulong local_70;
  unsigned_long local_68;
  unsigned_long local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined4 local_24;
  undefined8 local_20;
  long local_18;
  long local_10;
  
  local_48 = param_2 + 3U >> 2;
  local_50 = param_3 + 0xfU >> 4;
  local_40 = param_7;
  local_38 = param_6;
  local_30 = param_5;
  local_24 = param_1;
  local_20 = param_4;
  local_18 = param_3;
  local_10 = param_2;
  for (local_58 = 0; local_58 < local_50; local_58 = local_58 + 1) {
    local_68 = local_18 + local_58 * -0x10;
    puVar1 = std::min<unsigned_long>
                       (&mgemm<float,_float,_remora::bindings::gemm_block_size<float>_>::NR,
                        &local_68);
    local_60 = *puVar1;
    for (local_70 = 0; local_70 < local_48; local_70 = local_70 + 1) {
      local_80 = local_10 + local_70 * -4;
      puVar1 = std::min<unsigned_long>
                         (&mgemm<float,_float,_remora::bindings::gemm_block_size<float>_>::MR,
                          &local_80);
      local_78 = *puVar1;
      lVar2 = local_40 + local_70 * 4 * j0 * 4 + local_58 * 0x10 * i0 * 4;
      if ((local_78 == 4) && (local_60 == 0x10)) {
        ugemm<remora::bindings::gemm_block_size<float>,float,float>
                  (CTempBlock._24_8_,CTempBlock[5],(float *)CTempBlock._8_8_,
                   (float *)CTempBlock._0_8_,param_10,i0,j0);
      }
      else {
        std::fill_n<float*,unsigned_long,float>
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                   (float *)(ulong)in_stack_fffffffffffffe70);
        ugemm<remora::bindings::gemm_block_size<float>,float,float>
                  (CTempBlock._24_8_,CTempBlock[5],(float *)CTempBlock._8_8_,
                   (float *)CTempBlock._0_8_,param_10,i0,j0);
        for (local_198 = 0; local_198 < local_78; local_198 = local_198 + 1) {
          for (local_1a0 = 0; local_1a0 < local_60; local_1a0 = local_1a0 + 1) {
            lVar3 = local_198 * j0 + local_1a0 * i0;
            *(float *)(lVar2 + lVar3 * 4) =
                 *(float *)(&stack0xfffffffffffffe78 + (local_198 * 0x10 + local_1a0) * 4) +
                 *(float *)(lVar2 + lVar3 * 4);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void mgemm(
	std::size_t mc, std::size_t nc, std::size_t kc, TC alpha,
	T const* A, T const* B, TC *C,
	std::size_t stride1, std::size_t stride2, block_size
){
	static std::size_t const MR = block_size::mr;
	static std::size_t const NR = block_size::nr;
	std::size_t const mp  = (mc+MR-1) / MR;
	std::size_t const np  = (nc+NR-1) / NR;

	for (std::size_t j=0; j<np; ++j) {
		std::size_t const nr = std::min(NR, nc - j*NR);

		for (std::size_t i=0; i<mp; ++i) {
			std::size_t const mr = std::min(MR, mc - i*MR);
			auto CBlockStart = C+i*MR*stride1+j*NR*stride2;
			if (mr==MR && nr==NR) {
				ugemm<block_size>(
					kc, alpha,
					&A[i*kc*MR], &B[j*kc*NR],
					CBlockStart, stride1, stride2
				);
			} else {
				TC CTempBlock[MR*NR];
				std::fill_n(CTempBlock, MR*NR, T(0));
				ugemm<block_size>(
					kc, alpha,
					&A[i*kc*MR], &B[j*kc*NR],
					CTempBlock, NR, 1
				);

				for (std::size_t i0=0; i0<mr; ++i0){
					for (std::size_t j0=0; j0<nr; ++j0) {
						CBlockStart[i0*stride1+j0 * stride2] += CTempBlock[i0*NR+j0];
					}
				}
			}
		}
	}
}